

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall fmt::v7::detail::bigint::multiply(bigint *this,uint64_t value)

{
  size_t sVar1;
  uint *puVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  sVar1 = (this->bigits_).super_buffer<unsigned_int>.size_;
  if (sVar1 == 0) {
    uVar6 = 0;
  }
  else {
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar6 = 0;
    sVar3 = 0;
    do {
      uVar4 = (ulong)puVar2[sVar3];
      uVar5 = (uVar6 & 0xffffffff) + (value & 0xffffffff) * uVar4;
      puVar2[sVar3] = (uint)uVar5;
      uVar6 = (uVar6 >> 0x20) + uVar4 * (value >> 0x20) + (uVar5 >> 0x20);
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  for (; uVar6 != 0; uVar6 = uVar6 >> 0x20) {
    if ((this->bigits_).super_buffer<unsigned_int>.capacity_ <
        (this->bigits_).super_buffer<unsigned_int>.size_ + 1) {
      (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
    }
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    sVar1 = (this->bigits_).super_buffer<unsigned_int>.size_;
    (this->bigits_).super_buffer<unsigned_int>.size_ = sVar1 + 1;
    puVar2[sVar1] = (uint)uVar6;
  }
  return;
}

Assistant:

void multiply(uint64_t value) {
    const bigit mask = ~bigit(0);
    const double_bigit lower = value & mask;
    const double_bigit upper = value >> bigit_bits;
    double_bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      double_bigit result = bigits_[i] * lower + (carry & mask);
      carry =
          bigits_[i] * upper + (result >> bigit_bits) + (carry >> bigit_bits);
      bigits_[i] = static_cast<bigit>(result);
    }
    while (carry != 0) {
      bigits_.push_back(carry & mask);
      carry >>= bigit_bits;
    }
  }